

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint32 ma_pcm_rb_available_write(ma_pcm_rb *pRB)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    uVar1 = (pRB->rb).encodedReadOffset;
    uVar2 = (pRB->rb).encodedWriteOffset;
    iVar3 = (uVar2 & 0x7fffffff) - (uVar1 & 0x7fffffff);
    if ((int)(uVar2 ^ uVar1) < 0) {
      iVar3 = iVar3 + (pRB->rb).subbufferSizeInBytes;
    }
    return ((pRB->rb).subbufferSizeInBytes - iVar3) / ((&DAT_0019eb10)[pRB->format] * pRB->channels)
    ;
  }
  return 0;
}

Assistant:

MA_API ma_uint32 ma_pcm_rb_available_write(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return ma_rb_available_write(&pRB->rb) / ma_pcm_rb_get_bpf(pRB);
}